

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O0

bool __thiscall TaprootBuilder::IsComplete(TaprootBuilder *this)

{
  long lVar1;
  size_type sVar2;
  byte *in_RDI;
  long in_FS_OFFSET;
  undefined5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = false;
  uVar3 = uVar5;
  if ((*in_RDI & 1) != 0) {
    sVar2 = std::
            vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
            ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    *)CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,
                                        CONCAT15(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffd8
                                                ))));
    uVar4 = true;
    uVar3 = uVar4;
    if (sVar2 != 0) {
      sVar2 = std::
              vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
              ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      *)CONCAT17(1,CONCAT16(in_stack_ffffffffffffffde,
                                            CONCAT15(in_stack_ffffffffffffffdd,
                                                     in_stack_ffffffffffffffd8))));
      uVar3 = false;
      if (sVar2 == 1) {
        std::
        vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      *)CONCAT17(uVar5,in_stack_ffffffffffffffe8),(size_type)in_RDI);
        uVar3 = std::optional<TaprootBuilder::NodeInfo>::has_value
                          ((optional<TaprootBuilder::NodeInfo> *)
                           CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffffdd,
                                                                  in_stack_ffffffffffffffd8))));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool IsComplete() const { return m_valid && (m_branch.size() == 0 || (m_branch.size() == 1 && m_branch[0].has_value())); }